

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

string * __thiscall
duckdb::BoxRenderer::FormatNumber(string *__return_storage_ptr__,BoxRenderer *this,string *input)

{
  size_type sVar1;
  string *number;
  idx_t c;
  ulong uVar2;
  char cVar3;
  idx_t c_1;
  size_type sVar4;
  ulong uVar5;
  string *__range1;
  
  if ((this->config).large_number_rendering == ALL) {
    TryFormatLargeNumber(__return_storage_ptr__,this,input);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  if ((this->config).thousand_separator == '\0' && (this->config).decimal_separator == '\0') {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    for (sVar1 = 0;
        (sVar4 = input->_M_string_length, input->_M_string_length != sVar1 &&
        (sVar4 = sVar1, (byte)((input->_M_dataplus)._M_p[sVar1] - 0x30U) < 10)); sVar1 = sVar1 + 1)
    {
    }
    uVar2 = 0;
    uVar5 = sVar4 % 3;
    if (sVar4 % 3 == 0) {
      uVar5 = 3;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (; cVar3 = (char)__return_storage_ptr__, sVar4 != uVar2; uVar2 = uVar2 + 1) {
      if ((uVar2 == uVar5) && ((this->config).thousand_separator != '\0')) {
        ::std::__cxx11::string::push_back(cVar3);
        uVar5 = uVar5 + 3;
      }
      ::std::__cxx11::string::push_back(cVar3);
    }
    for (; sVar4 < input->_M_string_length; sVar4 = sVar4 + 1) {
      ::std::__cxx11::string::push_back(cVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::FormatNumber(const string &input) {
	if (config.large_number_rendering == LargeNumberRendering::ALL) {
		// when large number rendering is set to ALL, we try to format all numbers as large numbers
		auto number = TryFormatLargeNumber(input);
		if (!number.empty()) {
			return number;
		}
	}
	if (config.decimal_separator == '\0' && config.thousand_separator == '\0') {
		// no thousand separator
		return input;
	}
	// first check how many digits there are (preceding any decimal point)
	idx_t character_count = 0;
	for (auto c : input) {
		if (!StringUtil::CharacterIsDigit(c)) {
			break;
		}
		character_count++;
	}
	// find the position of the first thousand separator
	idx_t separator_position = character_count % 3 == 0 ? 3 : character_count % 3;
	// now add the thousand separators
	string result;
	for (idx_t c = 0; c < character_count; c++) {
		if (c == separator_position && config.thousand_separator != '\0') {
			result += config.thousand_separator;
			separator_position += 3;
		}
		result += input[c];
	}
	// add any remaining characters
	for (idx_t c = character_count; c < input.size(); c++) {
		if (input[c] == '.' && config.decimal_separator != '\0') {
			result += config.decimal_separator;
		} else {
			result += input[c];
		}
	}
	return result;
}